

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph-routing.c
# Opt level: O0

void mpr_calculate_neighbor_graph_routing(nhdp_domain *domain,neighbor_graph *graph)

{
  neighbor_graph_interface *methods_00;
  neighbor_graph_interface *methods;
  neighbor_graph *graph_local;
  nhdp_domain *domain_local;
  
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph-routing.c",0x148,(void *)0x0,0,
             "Calculate neighbor graph for routing MPRs");
  }
  methods_00 = _get_neighbor_graph_interface_routing();
  mpr_init_neighbor_graph(graph,methods_00);
  _calculate_n1(domain,graph);
  _calculate_n2(domain,graph);
  return;
}

Assistant:

void
mpr_calculate_neighbor_graph_routing(const struct nhdp_domain *domain, struct neighbor_graph *graph) {
  struct neighbor_graph_interface *methods;

  OONF_DEBUG(LOG_MPR, "Calculate neighbor graph for routing MPRs");

  methods = _get_neighbor_graph_interface_routing();

  mpr_init_neighbor_graph(graph, methods);
  _calculate_n1(domain, graph);
  _calculate_n2(domain, graph);
}